

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O0

void __thiscall RefCount::Ptr<TestObject>::~Ptr(Ptr<TestObject> *this)

{
  uint64 uVar1;
  Ptr<TestObject> *this_local;
  
  if (((this->refObj != (Object *)0x0) &&
      (uVar1 = Atomic::decrement(&this->refObj->ref), uVar1 == 0)) &&
     (this->refObj != (Object *)0x0)) {
    (*this->refObj->_vptr_Object[1])();
  }
  return;
}

Assistant:

~Ptr()
    {
      if(refObj && Atomic::decrement(refObj->ref) == 0)
        delete refObj;
    }